

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Result.cpp
# Opt level: O2

void __thiscall Result::showyourself(Result *this)

{
  pointer pCVar1;
  ostream *poVar2;
  pointer pCVar3;
  Core core;
  Core CStack_48;
  
  pCVar1 = (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pCVar3 = (this->Cores).super__Vector_base<Core,_std::allocator<Core>_>._M_impl.
                super__Vector_impl_data._M_start; pCVar3 != pCVar1; pCVar3 = pCVar3 + 1) {
    Core::Core(&CStack_48,pCVar3);
    Core::showyourself(&CStack_48);
    std::_Vector_base<Task,_std::allocator<Task>_>::~_Vector_base
              (&CStack_48.MyTasks.super__Vector_base<Task,_std::allocator<Task>_>);
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"Total time: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->longestProcessingTime);
  std::operator<<(poVar2,"\n");
  return;
}

Assistant:

void Result::showyourself(){
	for (auto core : Cores)
		core.showyourself();
	std::cout<<"Total time: "<<longestProcessingTime<<"\n";
}